

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_subset.c
# Opt level: O1

_Bool array_container_is_subset_bitset(array_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((container2->cardinality == -1) || (container1->cardinality <= container2->cardinality)) {
    uVar4 = (ulong)container1->cardinality;
    bVar3 = (long)uVar4 < 1;
    if (0 < (long)uVar4) {
      uVar1 = *container1->array;
      if ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        uVar2 = 1;
        do {
          uVar5 = uVar2;
          if (uVar4 == uVar5) break;
          uVar1 = container1->array[uVar5];
          uVar2 = uVar5 + 1;
        } while ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0);
        return uVar4 <= uVar5;
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool array_container_is_subset_bitset(const array_container_t* container1,
                                      const bitset_container_t* container2) {
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < container1->cardinality) {
            return false;
        }
    }
    for (int i = 0; i < container1->cardinality; ++i) {
        if (!bitset_container_contains(container2, container1->array[i])) {
            return false;
        }
    }
    return true;
}